

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O0

pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> __thiscall
QTriangulator<unsigned_int>::ComplexToSimple::outerBounds(ComplexToSimple *this,QPodPoint *point)

{
  QDataBuffer<QPodPoint> *this_00;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> pVar1;
  Node *pNVar2;
  int iVar3;
  Edge *pEVar4;
  qint64 qVar5;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  qint64 d_2;
  QPodPoint *v2_2;
  QPodPoint *v1_2;
  qint64 d_1;
  QPodPoint *v2_1;
  QPodPoint *v1_1;
  Node *mid;
  qint64 d;
  QPodPoint *v2;
  QPodPoint *v1;
  Node *current;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> result;
  QPodPoint *in_stack_ffffffffffffff28;
  QPodPoint *in_stack_ffffffffffffff30;
  QPodPoint *in_stack_ffffffffffffff38;
  QDataBuffer<QPodPoint> *pQVar6;
  Node *local_40;
  void *local_28;
  void *local_20;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (Node *)in_RDI[4];
  local_18.first = (Node *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.second = (Node *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = (void *)0x0;
  local_28 = (void *)0x0;
  std::pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*>::pair<std::nullptr_t,_std::nullptr_t,_true>
            (&local_18,&local_20,&local_28);
  while (pNVar2 = local_40, local_40 != (Node *)0x0) {
    pQVar6 = (QDataBuffer<QPodPoint> *)*in_RDI;
    pEVar4 = QDataBuffer<QTriangulator<unsigned_int>::ComplexToSimple::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_int>::ComplexToSimple::Edge> *)
                        (in_RDI + 1),(long)local_40->data);
    iVar3 = Edge::lower(pEVar4);
    QDataBuffer<QPodPoint>::at(pQVar6,(long)iVar3);
    pQVar6 = (QDataBuffer<QPodPoint> *)*in_RDI;
    pEVar4 = QDataBuffer<QTriangulator<unsigned_int>::ComplexToSimple::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_int>::ComplexToSimple::Edge> *)
                        (in_RDI + 1),(long)local_40->data);
    iVar3 = Edge::upper(pEVar4);
    QDataBuffer<QPodPoint>::at(pQVar6,(long)iVar3);
    qVar5 = qPointDistanceFromLine
                      (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28
                      );
    if (qVar5 == 0) break;
    if (qVar5 < 0) {
      local_18.second = local_40;
      local_40 = local_40->left;
    }
    else {
      local_18.first = local_40;
      local_40 = local_40->right;
    }
  }
  if (local_40 != (Node *)0x0) {
    local_40 = local_40->left;
    while (local_40 != (Node *)0x0) {
      pQVar6 = (QDataBuffer<QPodPoint> *)*in_RDI;
      pEVar4 = QDataBuffer<QTriangulator<unsigned_int>::ComplexToSimple::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_int>::ComplexToSimple::Edge> *)
                          (in_RDI + 1),(long)local_40->data);
      iVar3 = Edge::lower(pEVar4);
      QDataBuffer<QPodPoint>::at(pQVar6,(long)iVar3);
      pQVar6 = (QDataBuffer<QPodPoint> *)*in_RDI;
      pEVar4 = QDataBuffer<QTriangulator<unsigned_int>::ComplexToSimple::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_int>::ComplexToSimple::Edge> *)
                          (in_RDI + 1),(long)local_40->data);
      iVar3 = Edge::upper(pEVar4);
      QDataBuffer<QPodPoint>::at(pQVar6,(long)iVar3);
      qVar5 = qPointDistanceFromLine
                        (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                         in_stack_ffffffffffffff28);
      if (qVar5 == 0) {
        local_40 = local_40->left;
      }
      else {
        local_18.first = local_40;
        local_40 = local_40->right;
      }
    }
    local_40 = pNVar2->right;
    while (local_40 != (Node *)0x0) {
      pQVar6 = (QDataBuffer<QPodPoint> *)*in_RDI;
      pEVar4 = QDataBuffer<QTriangulator<unsigned_int>::ComplexToSimple::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_int>::ComplexToSimple::Edge> *)
                          (in_RDI + 1),(long)local_40->data);
      iVar3 = Edge::lower(pEVar4);
      QDataBuffer<QPodPoint>::at(pQVar6,(long)iVar3);
      this_00 = (QDataBuffer<QPodPoint> *)*in_RDI;
      pEVar4 = QDataBuffer<QTriangulator<unsigned_int>::ComplexToSimple::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_int>::ComplexToSimple::Edge> *)
                          (in_RDI + 1),(long)local_40->data);
      iVar3 = Edge::upper(pEVar4);
      QDataBuffer<QPodPoint>::at(this_00,(long)iVar3);
      qVar5 = qPointDistanceFromLine
                        ((QPodPoint *)pQVar6,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      if (qVar5 == 0) {
        local_40 = local_40->right;
      }
      else {
        local_18.second = local_40;
        local_40 = local_40->left;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  pVar1.second = local_18.second;
  pVar1.first = local_18.first;
  return pVar1;
}

Assistant:

std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> QTriangulator<T>::ComplexToSimple::outerBounds(const QPodPoint &point) const
{
    QRBTree<int>::Node *current = m_edgeList.root;
    std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> result(nullptr, nullptr);

    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        if (d == 0)
            break;
        if (d < 0) {
            result.second = current;
            current = current->left;
        } else {
            result.first = current;
            current = current->right;
        }
    }

    if (!current)
        return result;

    QRBTree<int>::Node *mid = current;

    current = mid->left;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d >= 0);
        if (d == 0) {
            current = current->left;
        } else {
            result.first = current;
            current = current->right;
        }
    }

    current = mid->right;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d <= 0);
        if (d == 0) {
            current = current->right;
        } else {
            result.second = current;
            current = current->left;
        }
    }

    return result;
}